

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O3

bool __thiscall test_CECoordinates::test_HmsDms2Angle(test_CECoordinates *this)

{
  undefined1 uVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  double test4b;
  double test4a;
  double test2b;
  double test2a;
  double ang_var;
  vector<double,_std::allocator<double>_> hrs_vec;
  double ang_rad;
  vector<double,_std::allocator<double>_> test3;
  vector<double,_std::allocator<double>_> test1;
  double tol_old;
  vector<double,_std::allocator<double>_> ang_vec;
  allocator local_e9;
  CEAngle local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  vector<double,_std::allocator<double>_> local_90;
  double local_78;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  undefined8 local_38;
  vector<double,_std::allocator<double>_> local_30;
  
  local_98 = 45.50833333333333;
  CEAngle::Deg(&local_e8,&local_98);
  local_40 = CEAngle::Rad(&local_e8);
  CEAngle::~CEAngle(&local_e8);
  local_78 = local_40;
  local_d8 = 0x403e000000000000;
  uStack_d0 = 0;
  local_e8._vptr_CEAngle = (_func_int **)0x4046800000000000;
  local_e8.angle_ = 30.0;
  std::allocator<double>::allocator((allocator<double> *)&local_90);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_30,__l,(allocator<double> *)&local_90)
  ;
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_90);
  local_d8 = 0x4000000000000000;
  uStack_d0 = 0;
  local_e8._vptr_CEAngle = (_func_int **)0x4008000000000000;
  local_e8.angle_ = 2.0;
  std::allocator<double>::allocator((allocator<double> *)&local_58);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,__l_00,(allocator<double> *)&local_58);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_58);
  local_38 = (**(code **)(*(long *)this + 0x20))(this);
  local_e8._vptr_CEAngle = (_func_int **)0x3da5fd7fe1796495;
  (**(code **)(*(long *)this + 0x30))(this);
  local_e8._vptr_CEAngle = (_func_int **)((ulong)local_e8._vptr_CEAngle & 0xffffffff00000000);
  CECoordinates::GetDMS(&local_58,&local_98,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&local_a0);
  local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x204;
  CETestSuite::test_vect((vector *)this,(vector *)&local_58,(string *)&local_30,(int *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_a0);
  local_e8._vptr_CEAngle = (_func_int **)((ulong)local_e8._vptr_CEAngle & 0xffffffff00000000);
  local_a0 = CECoordinates::DMSToAngle(&local_30,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&local_a8);
  local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x208;
  (**(code **)(*(long *)this + 0x58))(this,&local_a0,&local_98,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_a8);
  local_e8._vptr_CEAngle._0_4_ = 1;
  local_a8 = CECoordinates::DMSToAngle(&local_30,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&local_b0);
  local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x20a;
  (**(code **)(*(long *)this + 0x58))(this,&local_a8,&local_78,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_b0);
  local_e8._vptr_CEAngle._0_4_ = 0;
  CECoordinates::GetHMS(&local_70,&local_98,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&local_b8);
  local_b0 = (double)CONCAT44(local_b0._4_4_,0x20e);
  CETestSuite::test_vect((vector *)this,(vector *)&local_70,(string *)&local_90,(int *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_b8);
  local_e8._vptr_CEAngle._0_4_ = 0;
  local_b0 = CECoordinates::HMSToAngle(&local_90,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&local_bc);
  local_b8 = (double)CONCAT44(local_b8._4_4_,0x212);
  (**(code **)(*(long *)this + 0x58))(this,&local_b0,&local_98,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_bc);
  local_e8._vptr_CEAngle = (_func_int **)CONCAT44(local_e8._vptr_CEAngle._4_4_,1);
  local_b8 = CECoordinates::HMSToAngle(&local_90,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",&local_e9);
  local_bc = 0x214;
  (**(code **)(*(long *)this + 0x58))(this,&local_b8,&local_78,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_e9);
  (**(code **)(*(long *)this + 0x30))(this,&local_38);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  std::vector<double,_std::allocator<double>_>::~vector(&local_70);
  std::vector<double,_std::allocator<double>_>::~vector(&local_58);
  std::vector<double,_std::allocator<double>_>::~vector(&local_90);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  return (bool)uVar1;
}

Assistant:

bool test_CECoordinates::test_HmsDms2Angle(void)
{
    // Create some variables for testing
    double              ang_var(45.50833333333333);
    double              ang_rad = CEAngle::Deg(ang_var).Rad();
    std::vector<double> ang_vec = {45, 30, 30, 0.0};
    std::vector<double> hrs_vec = {3.0, 2.0, 2.0, 0.0};

    // Increase the acceptable tolerance
    double tol_old(DblTol());
    SetDblTol(1.0e-11);

    // Test angle -> DMS 
    std::vector<double> test1 = CECoordinates::GetDMS(ang_var, CEAngleType::DEGREES);
    test_vect(test1, ang_vec, __func__, __LINE__);

    // Test DMS -> angle
    double test2a(CECoordinates::DMSToAngle(ang_vec, CEAngleType::DEGREES));
    test_double(test2a, ang_var, __func__, __LINE__);
    double test2b(CECoordinates::DMSToAngle(ang_vec, CEAngleType::RADIANS));
    test_double(test2b, ang_rad, __func__, __LINE__);
    
    // Test angle -> HMS 
    std::vector<double> test3 = CECoordinates::GetHMS(ang_var, CEAngleType::DEGREES);
    test_vect(test3, hrs_vec, __func__, __LINE__);

    // Test HMS -> angle
    double test4a(CECoordinates::HMSToAngle(hrs_vec, CEAngleType::DEGREES));
    test_double(test4a, ang_var, __func__, __LINE__);
    double test4b(CECoordinates::HMSToAngle(hrs_vec, CEAngleType::RADIANS));
    test_double(test4b, ang_rad, __func__, __LINE__);

    // Reset the tolerance
    SetDblTol(tol_old);

    return pass();
}